

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# go_construct.cc
# Opt level: O3

void __thiscall re2c::CpgotoTable::CpgotoTable(CpgotoTable *this,Span *span,uint32_t nSpans)

{
  State *pSVar1;
  State **ppSVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  
  ppSVar2 = (State **)operator_new__(0x800);
  this->table = ppSVar2;
  if (nSpans != 0) {
    uVar3 = 0;
    uVar4 = 0;
    do {
      uVar6 = span[uVar3].ub;
      if (0xff < uVar6) {
        uVar6 = 0x100;
      }
      if (uVar4 < uVar6) {
        uVar5 = (ulong)uVar4;
        pSVar1 = span[uVar3].to;
        do {
          this->table[uVar5] = pSVar1;
          uVar5 = uVar5 + 1;
          uVar4 = uVar6;
        } while (uVar6 != uVar5);
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 != nSpans);
  }
  return;
}

Assistant:

CpgotoTable::CpgotoTable (const Span * span, uint32_t nSpans)
	: table (new const State * [TABLE_SIZE])
{
	uint32_t c = 0;
	for (uint32_t i = 0; i < nSpans; ++i)
	{
		for(; c < span[i].ub && c < TABLE_SIZE; ++c)
		{
			table[c] = span[i].to;
		}
	}
}